

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

bool __thiscall
ON_Plane::Rotate(ON_Plane *this,double sin_angle,double cos_angle,ON_3dVector *axis,
                ON_3dPoint *center)

{
  ON_3dVector *v;
  ON_3dPoint center_00;
  bool bVar1;
  ON_Xform rot;
  ON_3dVector local_b8;
  ON_Xform local_a0;
  
  ON_Xform::ON_Xform(&local_a0);
  bVar1 = ON_3dPoint::operator==(center,&this->origin);
  if (bVar1) {
    center_00.y = ON_3dPoint::Origin.y;
    center_00.x = ON_3dPoint::Origin.x;
    center_00.z = ON_3dPoint::Origin.z;
    ON_Xform::Rotation(&local_a0,sin_angle,cos_angle,*axis,center_00);
    ON_Xform::operator*(&local_b8,&local_a0,&this->xaxis);
    (this->xaxis).z = local_b8.z;
    (this->xaxis).x = local_b8.x;
    (this->xaxis).y = local_b8.y;
    ON_Xform::operator*(&local_b8,&local_a0,&this->yaxis);
    (this->yaxis).z = local_b8.z;
    (this->yaxis).x = local_b8.x;
    (this->yaxis).y = local_b8.y;
    v = &this->zaxis;
    bVar1 = ON_3dVector::operator==(axis,v);
    if (!bVar1) {
      ON_Xform::operator*(&local_b8,&local_a0,v);
      (this->zaxis).z = local_b8.z;
      v->x = local_b8.x;
      (this->zaxis).y = local_b8.y;
    }
    bVar1 = UpdateEquation(this);
  }
  else {
    ON_Xform::Rotation(&local_a0,sin_angle,cos_angle,*axis,*center);
    bVar1 = Transform(this,&local_a0);
  }
  return bVar1;
}

Assistant:

bool ON_Plane::Rotate(
      double sin_angle,          // sin(angle)
      double cos_angle,          // cos(angle)
      const ON_3dVector& axis, // axis of rotation
      const ON_3dPoint& center // center of rotation
      )
{
  bool rc = false;
  ON_Xform rot;
  if ( center == origin ) {
    rot.Rotation( sin_angle, cos_angle, axis, ON_3dPoint::Origin );
    xaxis = rot*xaxis;
    yaxis = rot*yaxis;
    if ( !(axis == zaxis) )
      zaxis = rot*zaxis;
    rc = UpdateEquation();
  }
  else {
    rot.Rotation( sin_angle, cos_angle, axis, center );
    rc = Transform( rot );
  }
  return rc;
}